

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O0

void __thiscall HPreData::printAR(HPreData *this,int i)

{
  bool bVar1;
  _Setw _Var2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  int in_ESI;
  int *in_RDI;
  int i_4;
  int i_3;
  int ind;
  int j;
  int i_2;
  size_t i_1;
  char buff [4];
  int cols;
  int rows;
  int local_48;
  int local_40;
  int local_30;
  int local_2c;
  int local_28;
  ulong local_20;
  char local_18 [4];
  int local_14;
  int local_10;
  
  local_10 = in_RDI[1];
  local_14 = *in_RDI;
  if (in_ESI != 0) {
    local_10 = in_RDI[2];
    local_14 = in_RDI[3];
  }
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  local_20 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18));
    if (sVar3 <= local_20) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),local_20);
    sprintf(local_18,"%2.1g ",*pvVar4);
    _Var2 = std::setw(5);
    poVar5 = std::operator<<((ostream *)&std::cout,_Var2);
    std::operator<<(poVar5,local_18);
    local_20 = local_20 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"------AR-|-b-----\n");
  local_28 = 0;
  do {
    if (local_10 <= local_28) {
      std::operator<<((ostream *)&std::cout,"------l------\n");
      for (local_40 = 0; local_40 < local_14; local_40 = local_40 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                            (long)local_40);
        if (*pvVar4 <= -1e+200) {
          sprintf(local_18,"-inf");
        }
        else {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                              (long)local_40);
          sprintf(local_18,"%2.1g ",*pvVar4);
        }
        _Var2 = std::setw(5);
        poVar5 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar5,local_18);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"------u------\n");
      for (local_48 = 0; local_48 < local_14; local_48 = local_48 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x24),
                            (long)local_48);
        if (1e+200 < *pvVar4 || *pvVar4 == 1e+200) {
          sprintf(local_18,"inf");
        }
        else {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x24),
                              (long)local_48);
          sprintf(local_18,"%2.1g ",*pvVar4);
        }
        _Var2 = std::setw(5);
        poVar5 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar5,local_18);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      return;
    }
    for (local_2c = 0; local_2c < local_14; local_2c = local_2c + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x54),(long)local_28);
      local_30 = *pvVar6;
      while( true ) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a),(long)local_30);
        bVar1 = false;
        if (*pvVar6 != local_2c) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x54),
                              (long)(local_28 + 1));
          bVar1 = local_30 < *pvVar6;
        }
        if (!bVar1) break;
        local_30 = local_30 + 1;
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a),(long)local_30);
      if (*pvVar6 == local_2c) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x54),
                            (long)(local_28 + 1));
        if (*pvVar6 <= local_30) goto LAB_001b8f26;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                            (long)local_30);
        sprintf(local_18,"%2.1g ",*pvVar4);
        _Var2 = std::setw(5);
        poVar5 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar5,local_18);
      }
      else {
LAB_001b8f26:
        _Var2 = std::setw(5);
        poVar5 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar5,"   ");
      }
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"  |   ");
    _Var2 = std::setw(5);
    poVar5 = std::operator<<(poVar5,_Var2);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a),(long)local_28);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
    poVar5 = std::operator<<(poVar5," < < ");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),(long)local_28);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void HPreData::printAR(int i) {
	int rows=numRow, cols=numCol;
	if (i) {
		rows = numRowOriginal;
		cols = numColOriginal;
	}

	cout<<"\n-----cost-----\n";

	char buff [4];
	for (size_t i=0;i<colCost.size();i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff;
	}
	cout<<endl;
	cout<<"------AR-|-b-----\n";
	for (int i=0;i<rows;i++) {
		for (int j=0;j<cols;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1])
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff;
				}
			else cout<<std::setw(5)<<"   ";

		}
		cout<<"  |   "<<std::setw(5)<<rowLower[i]<<" < < "<<rowUpper[i]<<endl;
	}
	cout<<"------l------\n";
	for (int i=0;i<cols;i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<cols;i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else
			sprintf(buff, "inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
}